

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O2

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  uint uVar8;
  char cVar9;
  uchar uVar10;
  ulong uVar11;
  int iVar12;
  
  pbVar3 = (byte *)(in + *in_len);
  sVar2 = *out_size;
  pbVar5 = out;
  pbVar6 = (byte *)in;
  do {
LAB_0013643e:
    do {
      if (((pbVar3 <= pbVar6) || (*pbVar6 == 0)) || (out + sVar2 <= pbVar5 + 4)) {
        *pbVar5 = 0;
        *in_len = (long)pbVar6 - (long)in;
        *out_size = (long)pbVar5 - (long)out;
        return 0;
      }
      iVar12 = s->i;
LAB_0013645d:
      if ((pbVar6 < pbVar3) && (iVar12 < 4)) {
        if (*pbVar6 != 0) {
          s->c = 0;
          bVar7 = true;
          do {
            cVar9 = '\0';
            do {
              if (((pbVar3 <= pbVar6) || (cVar9 != '\0')) || (bVar1 = *pbVar6, bVar1 == 0)) {
                if (bVar7) {
                  uVar10 = '\0';
LAB_001364fb:
                  s->quad[iVar12] = uVar10;
                }
                else {
                  s->len = s->len + 1;
                  if (cVar9 != '\0') {
                    uVar10 = cVar9 + 0xff;
                    goto LAB_001364fb;
                  }
                }
                iVar12 = s->i + 1;
                s->i = iVar12;
                goto LAB_0013645d;
              }
              uVar4 = (uint)bVar1;
              if (bVar1 == 0x2d) {
                uVar4 = 0x2b;
              }
              uVar8 = 0x2f;
              if ((char)uVar4 != '_') {
                uVar8 = uVar4;
              }
              pbVar6 = pbVar6 + 1;
              s->c = uVar8;
              if ((byte)((char)uVar8 + 0x85U) < 0xb0) break;
              if ("|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                  [uVar8 - 0x2b] == '$') {
                cVar9 = '\0';
              }
              else {
                cVar9 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                        [uVar8 - 0x2b] + -0x3d;
              }
              bVar7 = false;
            } while (uVar8 - 0x2b != 0x50);
            bVar7 = false;
          } while( true );
        }
        if (final == 0) goto LAB_0013643e;
        s->i = 0;
        goto LAB_0013653b;
      }
    } while ((final == 0) && (iVar12 != 4));
    s->i = 0;
    if (pbVar6 < pbVar3) {
LAB_0013653b:
      uVar11 = s->len;
      if (*pbVar6 == 0) goto LAB_0013654a;
    }
    else {
      uVar11 = s->len;
LAB_0013654a:
      if (s->c == 0x3d) {
        uVar11 = uVar11 - 1;
        s->len = uVar11;
      }
    }
    if (1 < uVar11) {
      *pbVar5 = s->quad[1] >> 4 | s->quad[0] << 2;
      uVar11 = s->len;
      if (uVar11 < 3) {
        pbVar5 = pbVar5 + 1;
      }
      else {
        pbVar5[1] = s->quad[2] >> 2 | s->quad[1] << 4;
        uVar11 = s->len;
        if (uVar11 < 4) {
          pbVar5 = pbVar5 + 2;
        }
        else {
          pbVar5[2] = s->quad[2] << 6 | s->quad[3];
          pbVar5 = pbVar5 + 3;
          uVar11 = s->len;
        }
      }
    }
    s->done = (s->done + uVar11) - 1;
    s->len = 0;
  } while( true );
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = *in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (v < 43 || v > 122) ? 0 : decode[v - 43];
				if (v)
					v = (v == '$') ? 0 : v - 61;
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = v - 1;
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = s->quad[0] << 2 | s->quad[1] >> 4;
		if (s->len >= 3)
			*out++ = s->quad[1] << 4 | s->quad[2] >> 2;
		if (s->len >= 4)
			*out++ = ((s->quad[2] << 6) & 0xc0) | s->quad[3];

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = in - orig_in;
	*out_size = out - orig_out;

	return 0;
}